

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::AddMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  int iVar1;
  cmState *this_00;
  char *__nptr;
  size_type sVar2;
  float local_84;
  float local_5c;
  float prog;
  int numGen;
  allocator local_41;
  string local_40;
  char *local_20;
  char *numGenC;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  numGenC = (char *)mf;
  mf_local = (cmMakefile *)this;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
            (&this->Makefiles,(value_type *)&numGenC);
  this_00 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_NUMBER_OF_MAKEFILES",&local_41);
  __nptr = cmState::GetInitializedCacheValue(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = __nptr;
  if (__nptr == (char *)0x0) {
    this->FirstTimeProgress = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    if (0.95 < this->FirstTimeProgress) {
      this->FirstTimeProgress = 0.95;
    }
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",this->FirstTimeProgress);
  }
  else {
    iVar1 = atoi(__nptr);
    sVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
    local_84 = (float)sVar2;
    local_5c = (local_84 * 0.9) / (float)iVar1;
    if (0.9 < local_5c) {
      local_5c = 0.9;
    }
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",local_5c);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(cmMakefile *mf)
{
  this->Makefiles.push_back(mf);

  // update progress
  // estimate how many lg there will be
  const char *numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue
    ("CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC)
    {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) /30.0f);
    if(this->FirstTimeProgress > 0.95f)
      {
      this->FirstTimeProgress = 0.95f;
      }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
    }

  int numGen = atoi(numGenC);
  float prog = 0.9f*static_cast<float>(this->Makefiles.size())/
    static_cast<float>(numGen);
  if (prog > 0.9f)
    {
    prog = 0.9f;
    }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}